

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlReaderNewDoc(xmlTextReaderPtr reader,xmlChar *cur,char *URL,char *encoding,int options)

{
  int iVar1;
  
  if (reader == (xmlTextReaderPtr)0x0 || cur == (xmlChar *)0x0) {
    return -1;
  }
  iVar1 = xmlStrlen(cur);
  iVar1 = xmlReaderNewMemory(reader,(char *)cur,iVar1,URL,encoding,options);
  return iVar1;
}

Assistant:

int
xmlReaderNewDoc(xmlTextReaderPtr reader, const xmlChar * cur,
                const char *URL, const char *encoding, int options)
{

    int len;

    if (cur == NULL)
        return (-1);
    if (reader == NULL)
        return (-1);

    len = xmlStrlen(cur);
    return (xmlReaderNewMemory(reader, (const char *)cur, len,
                               URL, encoding, options));
}